

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  FieldDescriptor *pFVar2;
  SCCAnalyzer *pSVar3;
  byte bVar4;
  Type TVar5;
  MessageAnalysis MVar6;
  pointer puVar7;
  pointer ppFVar8;
  Descriptor *pDVar9;
  SCC *pSVar10;
  LogMessage *pLVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar12;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *pFVar13;
  char *pcVar14;
  long lVar15;
  pointer puVar16;
  long *plVar17;
  ulong uVar18;
  Hex hex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks;
  undefined1 local_d0 [56];
  Printer *local_98;
  string local_90;
  long local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  string local_50;
  
  io::Printer::Print(printer,"bool $classname$::IsInitialized() const {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x68)) {
    io::Printer::Print(printer,"if (!_extensions_.IsInitialized()) {\n  return false;\n}\n\n");
    pDVar9 = this->descriptor_;
  }
  if (*(int *)(*(long *)(pDVar9 + 0x10) + 0x8c) != 3) {
    RequiredFieldsBitMask(&local_68,this);
    puVar16 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar18 = 0;
      puVar7 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar12 = extraout_RDX;
      do {
        uVar1 = puVar16[uVar18];
        if ((ulong)uVar1 != 0) {
          SimpleItoa_abi_cxx11_(&local_90,(protobuf *)(uVar18 & 0xffffffff),(int)uVar12);
          hex._8_8_ = 8;
          hex.value = (ulong)uVar1;
          strings::AlphaNum::AlphaNum((AlphaNum *)local_d0,hex);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,local_d0._0_8_,(char *)(local_d0._8_8_ + local_d0._0_8_));
          io::Printer::Print(printer,"if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n"
                             ,"i",&local_90,"mask",&local_50);
          uVar12 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            uVar12 = extraout_RDX_01;
          }
          puVar7 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar16 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            puVar7 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            uVar12 = extraout_RDX_02;
            puVar16 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)puVar7 - (long)puVar16 >> 2));
    }
    if (puVar16 != (pointer)0x0) {
      operator_delete(puVar16,(long)local_68.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)puVar16);
    }
  }
  ppFVar8 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
    uVar18 = 0;
    do {
      pFVar2 = ppFVar8[uVar18];
      TVar5 = FieldDescriptor::type(pFVar2);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4) == 10) {
        pSVar3 = this->scc_analyzer_;
        pDVar9 = FieldDescriptor::message_type(pFVar2);
        pSVar10 = SCCAnalyzer::GetSCC(pSVar3,pDVar9);
        MVar6 = SCCAnalyzer::GetSCCAnalysis(pSVar3,pSVar10);
        if (((uint)MVar6 & 0x1010000) != 0) {
          if (*(int *)(pFVar2 + 0x4c) == 3) {
            FieldName_abi_cxx11_((string *)local_d0,(cpp *)pFVar2,field);
            io::Printer::Print(printer,
                               "if (!::google::protobuf::internal::AllAreInitialized(this->$name$())) return false;\n"
                               ,"name",(string *)local_d0);
          }
          else {
            if (*(char *)(*(long *)(pFVar2 + 0x80) + 0x6f) != '\0') goto LAB_0025a8c9;
            pFVar13 = field;
            if (*(long *)(pFVar2 + 0x60) != 0) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0x10b6);
              pLVar11 = internal::LogMessage::operator<<
                                  ((LogMessage *)local_d0,
                                   "CHECK failed: !field->containing_oneof(): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar11);
              internal::LogMessage::~LogMessage((LogMessage *)local_d0);
              pFVar13 = extraout_RDX_03;
            }
            FieldName_abi_cxx11_((string *)local_d0,(cpp *)pFVar2,pFVar13);
            io::Printer::Print(printer,
                               "if (has_$name$()) {\n  if (!this->$name$_->IsInitialized()) return false;\n}\n"
                               ,"name",(string *)local_d0);
          }
          if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
            operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
          }
        }
      }
LAB_0025a8c9:
      uVar18 = uVar18 + 1;
      ppFVar8 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3)
            );
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x38)) {
    lVar15 = 0;
    local_98 = printer;
    do {
      local_70 = lVar15;
      if (0 < *(int *)(*(long *)(pDVar9 + 0x40) + 0x1c + lVar15 * 0x30)) {
        plVar17 = (long *)(*(long *)(pDVar9 + 0x40) + lVar15 * 0x30);
        lVar15 = 0;
LAB_0025a944:
        pFVar2 = *(FieldDescriptor **)(plVar17[4] + lVar15 * 8);
        TVar5 = FieldDescriptor::type(pFVar2);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4) != 10)
        goto LAB_0025a991;
        pSVar3 = this->scc_analyzer_;
        pDVar9 = FieldDescriptor::message_type(pFVar2);
        pSVar10 = SCCAnalyzer::GetSCC(pSVar3,pDVar9);
        MVar6 = SCCAnalyzer::GetSCCAnalysis(pSVar3,pSVar10);
        if (((uint)MVar6 & 0x1010000) == 0) goto LAB_0025a991;
        io::Printer::Print(printer,"switch ($oneofname$_case()) {\n","oneofname",(string *)*plVar17)
        ;
        io::Printer::Indent(printer);
        if (0 < *(int *)((long)plVar17 + 0x1c)) {
          lVar15 = 0;
          do {
            pFVar2 = *(FieldDescriptor **)(plVar17[4] + lVar15 * 8);
            UnderscoresToCamelCase((string *)local_d0,*(string **)pFVar2,true);
            io::Printer::Print(printer,"case k$field_name$: {\n","field_name",(string *)local_d0);
            if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
              operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
            }
            io::Printer::Indent(local_98);
            TVar5 = FieldDescriptor::type(pFVar2);
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4) == 10) {
              pSVar3 = this->scc_analyzer_;
              pDVar9 = FieldDescriptor::message_type(pFVar2);
              pSVar10 = SCCAnalyzer::GetSCC(pSVar3,pDVar9);
              MVar6 = SCCAnalyzer::GetSCCAnalysis(pSVar3,pSVar10);
              if (((uint)MVar6 & 0x1010000) != 0) {
                if ((*(char *)(*(long *)(pFVar2 + 0x80) + 0x6f) != '\0') ||
                   (bVar4 = 0, pFVar13 = extraout_RDX_04, *(long *)(pFVar2 + 0x60) == 0)) {
                  internal::LogMessage::LogMessage
                            ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                             ,0x10e6);
                  pLVar11 = internal::LogMessage::operator<<
                                      ((LogMessage *)local_d0,
                                       "CHECK failed: !(field->options().weak() || !field->containing_oneof()): "
                                      );
                  internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar11);
                  internal::LogMessage::~LogMessage((LogMessage *)local_d0);
                  bVar4 = *(byte *)(*(long *)(pFVar2 + 0x80) + 0x6f);
                  pFVar13 = extraout_RDX_05;
                }
                if ((bVar4 & 1) == 0) {
                  FieldName_abi_cxx11_((string *)local_d0,(cpp *)pFVar2,pFVar13);
                  io::Printer::Print(local_98,
                                     "if (has_$name$()) {\n  if (!this->$name$().IsInitialized()) return false;\n}\n"
                                     ,"name",(string *)local_d0);
                  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
                    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
                  }
                }
              }
            }
            printer = local_98;
            io::Printer::Print(local_98,"break;\n");
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n");
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)((long)plVar17 + 0x1c));
        }
        local_d0._0_8_ = local_d0 + 0x10;
        lVar15 = *(long *)*plVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,lVar15,((long *)*plVar17)[1] + lVar15);
        if ((char *)local_d0._8_8_ != (char *)0x0) {
          pcVar14 = (char *)0x0;
          do {
            if ((byte)(*(char *)(local_d0._0_8_ + (long)pcVar14) + 0x9fU) < 0x1a) {
              *(char *)(local_d0._0_8_ + (long)pcVar14) =
                   *(char *)(local_d0._0_8_ + (long)pcVar14) + -0x20;
            }
            pcVar14 = pcVar14 + 1;
          } while ((char *)local_d0._8_8_ != pcVar14);
        }
        io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n",
                           "cap_oneof_name",(string *)local_d0);
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
LAB_0025ac16:
      lVar15 = local_70 + 1;
      pDVar9 = this->descriptor_;
    } while (lVar15 < *(int *)(pDVar9 + 0x38));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return true;\n}\n");
  return;
LAB_0025a991:
  lVar15 = lVar15 + 1;
  if (*(int *)((long)plVar17 + 0x1c) <= lVar15) goto LAB_0025ac16;
  goto LAB_0025a944;
}

Assistant:

void MessageGenerator::
GenerateIsInitialized(io::Printer* printer) {
  printer->Print(
    "bool $classname$::IsInitialized() const {\n",
    "classname", classname_);
  printer->Indent();

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!_extensions_.IsInitialized()) {\n"
      "  return false;\n"
      "}\n\n");
  }

  if (HasFieldPresence(descriptor_->file())) {
    // Check that all required fields in this message are set.  We can do this
    // most efficiently by checking 32 "has bits" at a time.
    const std::vector<uint32> masks = RequiredFieldsBitMask();

    for (int i = 0; i < masks.size(); i++) {
      uint32 mask = masks[i];
      if (mask == 0) {
        continue;
      }

      // TODO(ckennelly): Consider doing something similar to ByteSizeLong(),
      // where we check all of the required fields in a single branch (assuming
      // that we aren't going to benefit from early termination).
      printer->Print(
        "if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
        "i", SimpleItoa(i),
        "mask", StrCat(strings::Hex(mask, strings::ZERO_PAD_8)));
    }
  }

  // Now check that all non-oneof embedded messages are initialized.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    // TODO(ckennelly): Push this down into a generator?
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field, options_) &&
        scc_analyzer_->HasRequiredFields(field->message_type())) {
      if (field->is_repeated()) {
        printer->Print(
          "if (!::google::protobuf::internal::AllAreInitialized(this->$name$()))"
          " return false;\n",
          "name", FieldName(field));
      } else if (field->options().weak()) {
        continue;
      } else {
        GOOGLE_CHECK(!field->containing_oneof());
        printer->Print(
            "if (has_$name$()) {\n"
            "  if (!this->$name$_->IsInitialized()) return false;\n"
            "}\n",
            "name", FieldName(field));
      }
    }
  }
  if (num_weak_fields_) {
    // For Weak fields.
    printer->Print("if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  // Go through the oneof fields, emitting a switch if any might have required
  // fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);

    bool has_required_fields = false;
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);

      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        has_required_fields = true;
        break;
      }
    }

    if (!has_required_fields) {
      continue;
    }

    printer->Print(
        "switch ($oneofname$_case()) {\n",
        "oneofname", oneof->name());
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();

      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        GOOGLE_CHECK(!(field->options().weak() || !field->containing_oneof()));
        if (field->options().weak()) {
          // Just skip.
        } else {
          printer->Print(
            "if (has_$name$()) {\n"
            "  if (!this->$name$().IsInitialized()) return false;\n"
            "}\n",
            "name", FieldName(field));
        }
      }

      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(oneof->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}